

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::read_access_chain
          (CompilerHLSL *this,string *expr,string *lhs,SPIRAccessChain *chain)

{
  string *psVar1;
  string *psVar2;
  CompilerHLSL *this_00;
  uint32_t uVar3;
  SPIRType *pSVar4;
  CompilerError *pCVar5;
  uint uVar6;
  char (*in_R8) [2];
  string *in_R9;
  uint uVar7;
  uint uVar8;
  char (*pacVar9) [2];
  undefined4 in_stack_fffffffffffffc78;
  uint uVar10;
  string local_378;
  SPIRAccessChain *local_358;
  char *local_350;
  string load_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  CompilerHLSL *local_308;
  string template_expr;
  SPIRType scalar_type;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint local_a8 [8];
  TypeID local_88;
  undefined8 local_70;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  pSVar4 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(chain->super_IVariant).field_0xc);
  local_180._32_8_ = local_180 + 0x38;
  local_180._8_4_ = 0;
  local_180._0_8_ = &PTR__SPIRType_003a6498;
  local_180._16_4_ = 0;
  local_180._40_8_ = 0;
  local_180._48_8_ = 8;
  local_180._88_8_ = local_180 + 0x70;
  local_180._96_8_ = 0;
  local_180._104_8_ = 8;
  local_180._120_4_ = 0;
  local_180[0x7c] = false;
  local_180[0x7d] = false;
  pacVar9 = (char (*) [2])0x8;
  local_180._12_4_ = StorageClassGeneric;
  local_180._136_8_ = local_180 + 0xa0;
  local_180._144_8_ = 0;
  local_180._152_8_ = 8;
  local_c0 = local_a8;
  local_b8 = 0;
  local_b0 = 8;
  local_88.id = 0;
  local_70._0_4_ = 0;
  local_70._4_4_ = 0;
  local_68 = &p_Stack_38;
  local_60 = 1;
  local_58._M_nxt = (_Hash_node_base *)0x0;
  sStack_50 = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_180._20_4_ = pSVar4->vecsize;
  uVar3 = pSVar4->columns;
  local_180._24_4_ = uVar3;
  local_180._128_4_ = local_180._12_4_;
  if ((pSVar4->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    read_access_chain_array(this,lhs,chain);
    goto LAB_00261496;
  }
  if (*(int *)&(pSVar4->super_IVariant).field_0xc == 0xf) {
    read_access_chain_struct(this,lhs,chain);
    goto LAB_00261496;
  }
  if ((pSVar4->width != 0x20) && (this->field_0x2425 == '\0')) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&scalar_type,
               "Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and native 16-bit types are enabled."
               ,(allocator *)&load_expr);
    CompilerError::CompilerError(pCVar5,(string *)&scalar_type);
    __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar10 = *(uint *)&(this->super_CompilerGLSL).field_0x241c;
  load_expr._M_dataplus._M_p = (pointer)&load_expr.field_2;
  load_expr._M_string_length = 0;
  template_expr._M_dataplus._M_p = (pointer)&template_expr.field_2;
  template_expr._M_string_length = 0;
  load_expr.field_2._M_local_buf[0] = '\0';
  template_expr.field_2._M_local_buf[0] = '\0';
  if (0x3d < uVar10) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_378,this,pSVar4,0);
    join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              ((string *)&scalar_type,(spirv_cross *)0x307d35,(char (*) [2])&local_378,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x310a41,in_R8);
    ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&scalar_type);
    ::std::__cxx11::string::~string((string *)&scalar_type);
    pacVar9 = (char (*) [2])0x260c7b;
    ::std::__cxx11::string::~string((string *)&local_378);
    uVar3 = pSVar4->columns;
  }
  local_358 = chain;
  local_308 = this;
  if (uVar3 == 1) {
    if (chain->row_major_matrix == false) {
      switch(pSVar4->vecsize) {
      case 1:
        local_378._M_dataplus._M_p = "Load";
        break;
      case 2:
        local_378._M_dataplus._M_p = "Load2";
        break;
      case 3:
        local_378._M_dataplus._M_p = "Load3";
        break;
      case 4:
        local_378._M_dataplus._M_p = "Load4";
        break;
      default:
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&scalar_type,"Unknown vector size.",(allocator *)&local_328);
        CompilerError::CompilerError(pCVar5,(string *)&scalar_type);
        __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (0x3d < uVar10) {
        local_378._M_dataplus._M_p = "Load";
      }
      in_R9 = (string *)0x31efa1;
      join<std::__cxx11::string_const&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[2]>
                ((string *)&scalar_type,(spirv_cross *)&chain->base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30abe2,
                 (char (*) [2])&local_378,(char **)&template_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31efa1,
                 (char (*) [2])&chain->dynamic_index,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &chain->static_index,(int *)0x30ae46,pacVar9);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      ::std::__cxx11::string::~string((string *)&scalar_type);
    }
    else {
      if (uVar10 < 0x3e) {
        if (1 < pSVar4->vecsize) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&scalar_type,this,local_180,0);
          ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
          ::std::__cxx11::string::~string((string *)&scalar_type);
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      }
      else {
        SPIRType::SPIRType(&scalar_type,pSVar4);
        scalar_type.vecsize = 1;
        scalar_type.columns = 1;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_328,this,&scalar_type,0);
        join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (&local_378,(spirv_cross *)0x307d35,(char (*) [2])&local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x310a41,
                   in_R8);
        ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&local_378);
        ::std::__cxx11::string::~string((string *)&local_378);
        ::std::__cxx11::string::~string((string *)&local_328);
        if (1 < pSVar4->vecsize) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_328,this,pSVar4,0);
          ::std::operator+(&local_378,&local_328,"(");
          ::std::__cxx11::string::append((string *)&load_expr);
          ::std::__cxx11::string::~string((string *)&local_378);
          ::std::__cxx11::string::~string((string *)&local_328);
        }
        SPIRType::~SPIRType(&scalar_type);
      }
      psVar1 = &local_358->base;
      psVar2 = &local_358->dynamic_index;
      uVar7 = 0;
      while (uVar7 < pSVar4->vecsize) {
        local_378._M_dataplus._M_p._0_4_ =
             local_358->matrix_stride * uVar7 + local_358->static_index;
        in_R9 = psVar2;
        join<std::__cxx11::string_const&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                  ((string *)&scalar_type,(spirv_cross *)psVar1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                   (char (*) [6])&template_expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31efa1,
                   (char (*) [2])psVar2,&local_378,(uint *)0x30ae46,
                   (char (*) [2])CONCAT44(uVar10,in_stack_fffffffffffffc78));
        ::std::__cxx11::string::append((string *)&load_expr);
        ::std::__cxx11::string::~string((string *)&scalar_type);
        uVar7 = uVar7 + 1;
        if (uVar7 < pSVar4->vecsize) {
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      }
      if (1 < pSVar4->vecsize) goto LAB_00260fdd;
    }
  }
  else if (chain->row_major_matrix == false) {
    switch(pSVar4->vecsize) {
    case 1:
      local_350 = "Load";
      break;
    case 2:
      local_350 = "Load2";
      break;
    case 3:
      local_350 = "Load3";
      break;
    case 4:
      local_350 = "Load4";
      break;
    default:
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&scalar_type,"Unknown vector size.",(allocator *)&local_378);
      CompilerError::CompilerError(pCVar5,(string *)&scalar_type);
      __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (uVar10 < 0x3e) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&scalar_type,this,local_180,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      ::std::__cxx11::string::~string((string *)&scalar_type);
    }
    else {
      SPIRType::SPIRType(&scalar_type,pSVar4);
      scalar_type.columns = 1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_328,this,&scalar_type,0);
      join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_378,(spirv_cross *)0x307d35,(char (*) [2])&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x310a41,in_R8
                );
      ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&local_378);
      ::std::__cxx11::string::~string((string *)&local_378);
      ::std::__cxx11::string::~string((string *)&local_328);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_378,this,pSVar4,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&local_378);
      ::std::__cxx11::string::~string((string *)&local_378);
      local_350 = "Load";
      SPIRType::~SPIRType(&scalar_type);
    }
    pacVar9 = (char (*) [2])0x2612ed;
    ::std::__cxx11::string::append((char *)&load_expr);
    uVar7 = 0;
    while (uVar7 < pSVar4->columns) {
      local_378._M_dataplus._M_p._0_4_ = local_358->matrix_stride * uVar7 + local_358->static_index;
      in_R9 = (string *)0x31efa1;
      join<std::__cxx11::string_const&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                ((string *)&scalar_type,(spirv_cross *)&chain->base,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30abe2,
                 (char (*) [2])&local_350,(char **)&template_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31efa1,
                 (char (*) [2])&chain->dynamic_index,&local_378,(uint *)0x30ae46,pacVar9);
      ::std::__cxx11::string::append((string *)&load_expr);
      pacVar9 = (char (*) [2])0x26137b;
      ::std::__cxx11::string::~string((string *)&scalar_type);
      uVar7 = uVar7 + 1;
      if (uVar7 < pSVar4->columns) {
        pacVar9 = (char (*) [2])0x261398;
        ::std::__cxx11::string::append((char *)&load_expr);
      }
    }
    ::std::__cxx11::string::append((char *)&load_expr);
  }
  else {
    if (uVar10 < 0x3e) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&scalar_type,this,local_180,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      ::std::__cxx11::string::~string((string *)&scalar_type);
    }
    else {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&scalar_type,this,pSVar4,0);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&scalar_type);
      ::std::__cxx11::string::~string((string *)&scalar_type);
      SPIRType::SPIRType(&scalar_type,pSVar4);
      scalar_type.vecsize = 1;
      scalar_type.columns = 1;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (&local_328,this,&scalar_type,0);
      join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_378,(spirv_cross *)0x307d35,(char (*) [2])&local_328,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x310a41,in_R8
                );
      ::std::__cxx11::string::operator=((string *)&template_expr,(string *)&local_378);
      ::std::__cxx11::string::~string((string *)&local_378);
      ::std::__cxx11::string::~string((string *)&local_328);
      SPIRType::~SPIRType(&scalar_type);
    }
    ::std::__cxx11::string::append((char *)&load_expr);
    psVar1 = &local_358->base;
    psVar2 = &local_358->dynamic_index;
    uVar7 = 0;
    while (uVar8 = uVar7, uVar8 < pSVar4->columns) {
      uVar6 = 0;
      while (uVar7 = uVar8 + 1, uVar6 < pSVar4->vecsize) {
        local_378._M_dataplus._M_p._0_4_ =
             local_358->matrix_stride * uVar6 +
             (pSVar4->width >> 3) * uVar8 + local_358->static_index;
        in_R9 = psVar2;
        join<std::__cxx11::string_const&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,unsigned_int,char_const(&)[2]>
                  ((string *)&scalar_type,(spirv_cross *)psVar1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".Load",
                   (char (*) [6])&template_expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31efa1,
                   (char (*) [2])psVar2,&local_378,(uint *)0x30ae46,
                   (char (*) [2])CONCAT44(uVar10,in_stack_fffffffffffffc78));
        ::std::__cxx11::string::append((string *)&load_expr);
        ::std::__cxx11::string::~string((string *)&scalar_type);
        uVar6 = uVar6 + 1;
        if ((uVar6 < pSVar4->vecsize) || (uVar8 + 1 < pSVar4->columns)) {
          ::std::__cxx11::string::append((char *)&load_expr);
        }
      }
    }
LAB_00260fdd:
    ::std::__cxx11::string::append((char *)&load_expr);
  }
  this_00 = local_308;
  if (uVar10 < 0x3e) {
    (*(local_308->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x34])
              (&scalar_type,local_308,pSVar4,local_180);
    if (scalar_type.super_IVariant._8_8_ != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (&local_378,(spirv_cross *)&scalar_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31efa1,
                 (char (*) [2])&load_expr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ae46,
                 (char (*) [2])in_R9);
      ::std::__cxx11::string::operator=((string *)&load_expr,(string *)&local_378);
      ::std::__cxx11::string::~string((string *)&local_378);
    }
    ::std::__cxx11::string::~string((string *)&scalar_type);
  }
  if (lhs->_M_string_length == 0) {
    if (expr == (string *)0x0) {
      __assert_fail("expr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_hlsl.cpp"
                    ,0xf2a,
                    "void spirv_cross::CompilerHLSL::read_access_chain(string *, const string &, const SPIRAccessChain &)"
                   );
    }
    ::std::__cxx11::string::operator=((string *)expr,(string *)&load_expr);
  }
  else {
    CompilerGLSL::
    statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
              (&this_00->super_CompilerGLSL,lhs,(char (*) [4])0x31e8c7,&load_expr,
               (char (*) [2])0x304bae);
  }
  ::std::__cxx11::string::~string((string *)&template_expr);
  ::std::__cxx11::string::~string((string *)&load_expr);
LAB_00261496:
  SPIRType::~SPIRType((SPIRType *)local_180);
  return;
}

Assistant:

void CompilerHLSL::read_access_chain(string *expr, const string &lhs, const SPIRAccessChain &chain)
{
	auto &type = get<SPIRType>(chain.basetype);

	SPIRType target_type;
	target_type.basetype = SPIRType::UInt;
	target_type.vecsize = type.vecsize;
	target_type.columns = type.columns;

	if (!type.array.empty())
	{
		read_access_chain_array(lhs, chain);
		return;
	}
	else if (type.basetype == SPIRType::Struct)
	{
		read_access_chain_struct(lhs, chain);
		return;
	}
	else if (type.width != 32 && !hlsl_options.enable_16bit_types)
		SPIRV_CROSS_THROW("Reading types other than 32-bit from ByteAddressBuffer not yet supported, unless SM 6.2 and "
		                  "native 16-bit types are enabled.");

	bool templated_load = hlsl_options.shader_model >= 62;
	string load_expr;

	string template_expr;
	if (templated_load)
		template_expr = join("<", type_to_glsl(type), ">");

	// Load a vector or scalar.
	if (type.columns == 1 && !chain.row_major_matrix)
	{
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
			load_op = "Load";

		load_expr = join(chain.base, ".", load_op, template_expr, "(", chain.dynamic_index, chain.static_index, ")");
	}
	else if (type.columns == 1)
	{
		// Strided load since we are loading a column from a row-major matrix.
		if (templated_load)
		{
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
			if (type.vecsize > 1)
				load_expr += type_to_glsl(type) + "(";
		}
		else if (type.vecsize > 1)
		{
			load_expr = type_to_glsl(target_type);
			load_expr += "(";
		}

		for (uint32_t r = 0; r < type.vecsize; r++)
		{
			load_expr += join(chain.base, ".Load", template_expr, "(", chain.dynamic_index,
			                  chain.static_index + r * chain.matrix_stride, ")");
			if (r + 1 < type.vecsize)
				load_expr += ", ";
		}

		if (type.vecsize > 1)
			load_expr += ")";
	}
	else if (!chain.row_major_matrix)
	{
		// Load a matrix, column-major, the easy case.
		const char *load_op = nullptr;
		switch (type.vecsize)
		{
		case 1:
			load_op = "Load";
			break;
		case 2:
			load_op = "Load2";
			break;
		case 3:
			load_op = "Load3";
			break;
		case 4:
			load_op = "Load4";
			break;
		default:
			SPIRV_CROSS_THROW("Unknown vector size.");
		}

		if (templated_load)
		{
			auto vector_type = type;
			vector_type.columns = 1;
			template_expr = join("<", type_to_glsl(vector_type), ">");
			load_expr = type_to_glsl(type);
			load_op = "Load";
		}
		else
		{
			// Note, this loading style in HLSL is *actually* row-major, but we always treat matrices as transposed in this backend,
			// so row-major is technically column-major ...
			load_expr = type_to_glsl(target_type);
		}
		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			load_expr += join(chain.base, ".", load_op, template_expr, "(", chain.dynamic_index,
			                  chain.static_index + c * chain.matrix_stride, ")");
			if (c + 1 < type.columns)
				load_expr += ", ";
		}
		load_expr += ")";
	}
	else
	{
		// Pick out elements one by one ... Hopefully compilers are smart enough to recognize this pattern
		// considering HLSL is "row-major decl", but "column-major" memory layout (basically implicit transpose model, ugh) ...

		if (templated_load)
		{
			load_expr = type_to_glsl(type);
			auto scalar_type = type;
			scalar_type.vecsize = 1;
			scalar_type.columns = 1;
			template_expr = join("<", type_to_glsl(scalar_type), ">");
		}
		else
			load_expr = type_to_glsl(target_type);

		load_expr += "(";

		for (uint32_t c = 0; c < type.columns; c++)
		{
			for (uint32_t r = 0; r < type.vecsize; r++)
			{
				load_expr += join(chain.base, ".Load", template_expr, "(", chain.dynamic_index,
				                  chain.static_index + c * (type.width / 8) + r * chain.matrix_stride, ")");

				if ((r + 1 < type.vecsize) || (c + 1 < type.columns))
					load_expr += ", ";
			}
		}
		load_expr += ")";
	}

	if (!templated_load)
	{
		auto bitcast_op = bitcast_glsl_op(type, target_type);
		if (!bitcast_op.empty())
			load_expr = join(bitcast_op, "(", load_expr, ")");
	}

	if (lhs.empty())
	{
		assert(expr);
		*expr = move(load_expr);
	}
	else
		statement(lhs, " = ", load_expr, ";");
}